

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deliminator.cpp
# Opt level: O3

bool duckdb::OperatorIsDelimGet(LogicalOperator *op)

{
  reference this;
  pointer pLVar1;
  bool bVar2;
  
  bVar2 = true;
  if (op->type != LOGICAL_DELIM_GET) {
    if (op->type == LOGICAL_FILTER) {
      this = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&op->children,0);
      pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(this);
      if (pLVar1->type == LOGICAL_DELIM_GET) {
        return true;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool OperatorIsDelimGet(LogicalOperator &op) {
	if (op.type == LogicalOperatorType::LOGICAL_DELIM_GET) {
		return true;
	}
	if (op.type == LogicalOperatorType::LOGICAL_FILTER &&
	    op.children[0]->type == LogicalOperatorType::LOGICAL_DELIM_GET) {
		return true;
	}
	return false;
}